

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int ERKStepSetTable(void *arkode_mem,ARKodeButcherTable B)

{
  ARKodeButcherTable pAVar1;
  ARKodeButcherTable in_RSI;
  int retval;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeERKStepMem *)0xea4349);
  if (local_4 == 0) {
    if (in_RSI == (ARKodeButcherTable)0x0) {
      arkProcessError(local_20,-0x15,"ARKode::ERKStep","ERKStepSetTable",
                      "arkode_mem = NULL illegal.");
      local_4 = -0x15;
    }
    else {
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x18) = 0;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x10) = 0;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x14) = 0;
      ARKodeButcherTable_Space
                (*(ARKodeButcherTable *)((long)in_stack_ffffffffffffffd8 + 0x20),
                 (sunindextype *)&stack0xffffffffffffffd0,(sunindextype *)&stack0xffffffffffffffd4);
      ARKodeButcherTable_Free
                ((ARKodeButcherTable)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x20) = 0;
      local_20->liw = local_20->liw - (long)in_stack_ffffffffffffffd0;
      local_20->lrw = local_20->lrw - (long)in_stack_ffffffffffffffd4;
      *(int *)((long)in_stack_ffffffffffffffd8 + 0x18) = in_RSI->stages;
      *(int *)((long)in_stack_ffffffffffffffd8 + 0x10) = in_RSI->q;
      *(int *)((long)in_stack_ffffffffffffffd8 + 0x14) = in_RSI->p;
      pAVar1 = ARKodeButcherTable_Copy(in_RSI);
      *(ARKodeButcherTable *)((long)in_stack_ffffffffffffffd8 + 0x20) = pAVar1;
      if (*(long *)((long)in_stack_ffffffffffffffd8 + 0x20) == 0) {
        arkProcessError(local_20,-0x15,"ARKode::ERKStep","ERKStepSetTable",
                        "arkode_mem = NULL illegal.");
        local_4 = -0x15;
      }
      else {
        ARKodeButcherTable_Space
                  (*(ARKodeButcherTable *)((long)in_stack_ffffffffffffffd8 + 0x20),
                   (sunindextype *)&stack0xffffffffffffffd0,(sunindextype *)&stack0xffffffffffffffd4
                  );
        local_20->liw = (long)in_stack_ffffffffffffffd0 + local_20->liw;
        local_20->lrw = (long)in_stack_ffffffffffffffd4 + local_20->lrw;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int ERKStepSetTable(void *arkode_mem, ARKodeButcherTable B)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepSetTable",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* check for legal inputs */
  if (B == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepSetTable", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->B);
  step_mem->B = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /* set the relevant parameters */
  step_mem->stages = B->stages;
  step_mem->q = B->q;
  step_mem->p = B->p;

  /* copy the table into step memory */
  step_mem->B = ARKodeButcherTable_Copy(B);
  if (step_mem->B == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepSetTable", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  return(ARK_SUCCESS);
}